

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O3

void pzshape::TPZShapeCube::ProjectPoint3dCubeToRib
               (int side,TPZVec<Fad<double>_> *in,FADREAL *outval)

{
  long lVar1;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  local_80;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  local_70;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_60;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_40;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_20;
  
  lVar1 = (long)side;
  local_20.fadexpr_.left_.constant_ = (double)(&gRibTrans3dCube1d)[lVar1 * 3];
  local_20.fadexpr_.right_ = in->fStore;
  local_80.fadexpr_.left_ = &local_20;
  local_20.fadexpr_.left_.defaultVal = 0.0;
  local_40.fadexpr_.left_.constant_ = (double)(&DAT_01a301d8)[lVar1 * 3];
  local_40.fadexpr_.right_ = local_20.fadexpr_.right_ + 1;
  local_80.fadexpr_.right_ = &local_40;
  local_40.fadexpr_.left_.defaultVal = 0.0;
  local_70.fadexpr_.left_ = &local_80;
  local_60.fadexpr_.left_.constant_ = (double)(&DAT_01a301e0)[lVar1 * 3];
  local_60.fadexpr_.right_ = local_20.fadexpr_.right_ + 2;
  local_70.fadexpr_.right_ = &local_60;
  local_60.fadexpr_.left_.defaultVal = 0.0;
  Fad<double>::operator=(outval,&local_70);
  return;
}

Assistant:

void TPZShapeCube::ProjectPoint3dCubeToRib(int side, TPZVec<FADREAL> &in, FADREAL &outval)
	{
		outval = gRibTrans3dCube1d[side][0]*in[0]+gRibTrans3dCube1d[side][1]*in[1]+gRibTrans3dCube1d[side][2]*in[2];
	}